

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O1

bool operator<(Position *pos1,Position *pos2)

{
  bool bVar1;
  
  bVar1 = true;
  if ((int)pos2->reference_corner <= (int)pos1->reference_corner) {
    if (pos1->reference_corner != pos2->reference_corner) {
      return false;
    }
    if (pos2->layer <= pos1->layer) {
      if (pos1->layer != pos2->layer) {
        return false;
      }
      bVar1 = pos1->entry < pos2->entry;
    }
  }
  return bVar1;
}

Assistant:

bool operator< (const Position &pos1, const Position &pos2)
{
    if(pos1.reference_corner < pos2.reference_corner){
        return true;
    }
    else if(pos1.reference_corner == pos2.reference_corner){
        if(pos1.layer < pos2.layer){
            return true;
        }
        else if(pos1.layer == pos2.layer){
            return pos1.entry < pos2.entry;
        }
        else{
            return false;
        }
    }
    else{
        return false;
    }
}